

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnp::DynamicList>
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  Type schema;
  OrphanBuilder *builder;
  Fault local_20;
  Fault f;
  Orphan<capnp::DynamicValue> *this_local;
  
  f.exception = (Exception *)this;
  if (this->type == LIST) {
    this->type = UNKNOWN;
    schema = (this->field_1).listSchema.elementType;
    builder = kj::mv<capnp::_::OrphanBuilder>(&this->builder);
    capnp::Orphan<capnp::DynamicList>::Orphan(__return_storage_ptr__,(ListSchema)schema,builder);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x858,FAILED,"type == DynamicValue::LIST","\"Value type mismatch.\"",
             (char (*) [21])"Value type mismatch.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

Orphan<DynamicList> Orphan<DynamicValue>::releaseAs<DynamicList>() {
  KJ_REQUIRE(type == DynamicValue::LIST, "Value type mismatch.");
  type = DynamicValue::UNKNOWN;
  return Orphan<DynamicList>(listSchema, kj::mv(builder));
}